

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O2

void ForEachSortedOption(TidyDoc tdoc,OptionFunc OptionPrint)

{
  TidyOption p_Var1;
  uint uVar2;
  TidyOption *__base;
  OptionDesc d;
  AllOption_t tOption;
  
  d.name = (ctmbstr)tidyGetOptionList(tdoc);
  uVar2 = 0;
  while (d.name != (ctmbstr)0x0) {
    p_Var1 = tidyGetNextOption(tdoc,(TidyIterator *)&d);
    tOption.topt[uVar2] = p_Var1;
    uVar2 = uVar2 + 1;
  }
  tOption.topt[uVar2] = (TidyOption)0x0;
  __base = tOption.topt;
  qsort(__base,0x5f,8,cmpOpt);
  for (; *__base != (TidyOption)0x0; __base = __base + 1) {
    GetOption(tdoc,*__base,&d);
    (*OptionPrint)(tdoc,*__base,&d);
  }
  return;
}

Assistant:

static void ForEachSortedOption( TidyDoc tdoc, OptionFunc OptionPrint )
{
    AllOption_t tOption;
    const TidyOption *topt;

    getSortedOption( tdoc, &tOption );
    for( topt = tOption.topt; *topt; ++topt)
    {
        OptionDesc d;

        GetOption( tdoc, *topt, &d );
        (*OptionPrint)( tdoc, *topt, &d );
    }
}